

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::count(QStringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  QLatin1StringView str;
  QStringView needle_00;
  QStringView haystack_00;
  qsizetype qVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  storage_type_conflict *in_RCX;
  storage_type_conflict *in_RDX;
  long in_FS_OFFSET;
  QVarLengthArray<char16_t,_256LL> s;
  QVarLengthArray<char16_t,_256LL> *in_stack_fffffffffffffd40;
  char16_t *in_stack_fffffffffffffd48;
  QVLABaseBase *this;
  CaseSensitivity cs_00;
  char *in_stack_fffffffffffffd68;
  qsizetype local_280;
  qsizetype in_stack_fffffffffffffdb8;
  storage_type_conflict *psVar4;
  QStringView local_230;
  QVLABaseBase local_220 [22];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QStringView::size(&local_230);
  qVar2 = QLatin1String::size((QLatin1String *)&stack0xfffffffffffffdc0);
  if (qVar1 < qVar2) {
    local_280 = -1;
  }
  else {
    this = local_220;
    memset(this,0xaa,0x218);
    str.m_data = in_stack_fffffffffffffd68;
    str.m_size = qVar1;
    psVar4 = in_RDX;
    qt_from_latin1_to_qvla(str);
    pcVar3 = QVLABase<char16_t>::data((QVLABase<char16_t> *)this);
    cs_00 = (CaseSensitivity)((ulong)pcVar3 >> 0x20);
    QVLABaseBase::size(this);
    QStringView::QStringView<char16_t,_true>
              ((QStringView *)this,in_stack_fffffffffffffd48,(qsizetype)in_stack_fffffffffffffd40);
    haystack_00.m_data = psVar4;
    haystack_00.m_size = in_stack_fffffffffffffdb8;
    needle_00.m_data = in_RCX;
    needle_00.m_size = (qsizetype)in_RDX;
    local_280 = count(haystack_00,needle_00,cs_00);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(in_stack_fffffffffffffd40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_280;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QLatin1StringView needle, Qt::CaseSensitivity cs)
{
    if (haystack.size() < needle.size())
        return -1;

    QVarLengthArray<char16_t> s = qt_from_latin1_to_qvla(needle);
    return QtPrivate::count(haystack, QStringView(s.data(), s.size()), cs);
}